

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac.c
# Opt level: O3

int qrfac_cvkit(integer *m,integer *n,doublereal *a,integer *lda,logical *pivot,integer *ipvt,
               integer *lipvt,doublereal *rdiag,doublereal *acnorm,doublereal *wa)

{
  double *pdVar1;
  doublereal *x;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  integer iVar5;
  doublereal *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  doublereal *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long *plVar15;
  doublereal *pdVar16;
  bool bVar17;
  doublereal dVar18;
  double dVar19;
  double dVar20;
  long local_b0;
  long local_a8;
  long local_a0;
  long *local_98;
  integer *local_90;
  long local_88;
  doublereal *local_80;
  doublereal *local_78;
  long local_70;
  long local_68;
  doublereal *local_60;
  doublereal local_58;
  doublereal *local_50;
  doublereal local_48;
  
  uVar4 = *lda;
  local_90 = ipvt;
  local_58 = dpmpar_cvkit(&c__1);
  local_a8 = *n;
  local_98 = n;
  if (0 < local_a8) {
    pdVar11 = a;
    lVar10 = 1;
    do {
      dVar18 = enorm_cvkit(m,pdVar11);
      acnorm[lVar10 + -1] = dVar18;
      rdiag[lVar10 + -1] = dVar18;
      wa[lVar10 + -1] = dVar18;
      if (*pivot != 0) {
        local_90[lVar10 + -1] = lVar10;
      }
      pdVar11 = pdVar11 + uVar4;
      bVar17 = lVar10 != local_a8;
      lVar10 = lVar10 + 1;
    } while (bVar17);
    local_a8 = *local_98;
  }
  if (*m < local_a8) {
    local_a8 = *m;
  }
  if (0 < local_a8) {
    local_80 = a + ~uVar4;
    local_a8 = local_a8 + 1;
    local_88 = uVar4 * 8;
    local_70 = uVar4 * 8 + 8;
    local_78 = a + -uVar4;
    lVar10 = 1;
    plVar15 = local_98;
    do {
      if ((*pivot != 0) && (lVar10 <= *plVar15)) {
        lVar7 = lVar10 + -1;
        lVar8 = lVar10;
        do {
          pdVar1 = rdiag + lVar7;
          lVar7 = lVar7 + 1;
          lVar9 = lVar7;
          if (*pdVar1 < rdiag[lVar8 + -1] || *pdVar1 == rdiag[lVar8 + -1]) {
            lVar9 = lVar8;
          }
          lVar8 = lVar9;
        } while (lVar7 < *plVar15);
        if (lVar9 != lVar10) {
          lVar7 = *m;
          if (0 < lVar7) {
            lVar8 = (lVar9 * 8 + -8) * uVar4;
            lVar12 = (lVar10 * 8 + -8) * uVar4;
            lVar14 = 0;
            do {
              uVar3 = *(undefined8 *)((long)a + lVar14 * 8 + lVar12);
              *(undefined8 *)((long)a + lVar14 * 8 + lVar12) =
                   *(undefined8 *)((long)a + lVar14 * 8 + lVar8);
              *(undefined8 *)((long)a + lVar14 * 8 + lVar8) = uVar3;
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
          }
          rdiag[lVar9 + -1] = rdiag[lVar10 + -1];
          wa[lVar9 + -1] = wa[lVar10 + -1];
          iVar5 = local_90[lVar10 + -1];
          local_90[lVar10 + -1] = local_90[lVar9 + -1];
          local_90[lVar9 + -1] = iVar5;
        }
      }
      local_b0 = (*m - lVar10) + 1;
      pdVar11 = local_80 + lVar10;
      x = pdVar11 + lVar10 * uVar4;
      dVar18 = enorm_cvkit(&local_b0,x);
      pdVar6 = local_78;
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        dVar19 = *x;
        dVar18 = (doublereal)
                 (~-(ulong)(dVar19 < 0.0) & (ulong)dVar18 | (ulong)-dVar18 & -(ulong)(dVar19 < 0.0))
        ;
        lVar7 = *m;
        if (lVar10 <= lVar7) {
          lVar8 = lVar10 + -1;
          lVar9 = (lVar10 * 8 + -8) * uVar4;
          do {
            *(double *)((long)a + lVar8 * 8 + lVar9) =
                 *(double *)((long)a + lVar8 * 8 + lVar9) / dVar18;
            lVar8 = lVar8 + 1;
          } while (lVar8 < lVar7);
          dVar19 = *x;
        }
        *x = dVar19 + 1.0;
        lVar7 = lVar10 + 1;
        lVar8 = *plVar15;
        if (lVar8 <= lVar10) goto LAB_0011d304;
        local_60 = local_80 + lVar7;
        lVar12 = local_70 * lVar10;
        pdVar16 = (doublereal *)((long)a + lVar12);
        lVar9 = local_88;
        local_b0 = lVar8;
        local_68 = lVar7;
        local_50 = pdVar11;
        local_48 = dVar18;
        do {
          lVar14 = *m;
          local_a0 = lVar14 - lVar10;
          if (lVar10 <= lVar14) {
            dVar19 = 0.0;
            lVar13 = -1;
            do {
              dVar19 = dVar19 + *(double *)((long)pdVar6 + lVar13 * 8 + lVar12) * pdVar16[lVar13];
              lVar2 = lVar10 + lVar13;
              lVar13 = lVar13 + 1;
            } while (lVar2 + 1 < lVar14);
            dVar20 = *x;
            if (lVar10 <= lVar14) {
              lVar13 = -1;
              do {
                pdVar16[lVar13] =
                     *(double *)((long)pdVar6 + lVar13 * 8 + lVar12) * (-dVar19 / dVar20) +
                     pdVar16[lVar13];
                lVar2 = lVar10 + lVar13;
                lVar13 = lVar13 + 1;
              } while (lVar2 + 1 < lVar14);
            }
          }
          if (*pivot != 0) {
            dVar19 = rdiag[lVar7 + -1];
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              dVar20 = 1.0 - (local_50[lVar7 * uVar4] / dVar19) * (local_50[lVar7 * uVar4] / dVar19)
              ;
              dVar19 = SQRT((double)(~-(ulong)(dVar20 <= 0.0) & (ulong)dVar20)) * dVar19;
              rdiag[lVar7 + -1] = dVar19;
              dVar19 = dVar19 / wa[lVar7 + -1];
              if (dVar19 * dVar19 * 0.05 <= local_58) {
                dVar18 = enorm_cvkit(&local_a0,local_60 + lVar7 * uVar4);
                rdiag[lVar7 + -1] = dVar18;
                wa[lVar7 + -1] = dVar18;
                lVar8 = local_b0;
                lVar9 = local_88;
                dVar18 = local_48;
                lVar14 = local_a0;
              }
            }
          }
          local_a0 = lVar14;
          pdVar16 = (doublereal *)((long)pdVar16 + lVar9);
          bVar17 = lVar7 < lVar8;
          lVar14 = local_68;
          plVar15 = local_98;
          lVar7 = lVar7 + 1;
        } while (bVar17);
      }
      else {
LAB_0011d304:
        lVar14 = lVar10 + 1;
      }
      rdiag[lVar10 + -1] = -dVar18;
      lVar10 = lVar14;
    } while (lVar14 != local_a8);
  }
  return 0;
}

Assistant:

int qrfac_cvkit(integer *m, integer *n, doublereal *a, integer *
	lda, logical *pivot, integer *ipvt, integer *lipvt, doublereal *rdiag,
	 doublereal *acnorm, doublereal *wa)
{
    /* Initialized data */

    static doublereal one = 1.;
    static doublereal p05 = .05;
    static doublereal zero = 0.;

    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    doublereal d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    integer kmax;
    doublereal temp;
    integer i__, j, k, minmn;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal epsmch;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal ajnorm;
    integer jp1;
    doublereal sum;

/*<       integer m,n,lda,lipvt >*/
/*<       integer ipvt(lipvt) >*/
/*<       logical pivot >*/
/*<       double precision a(lda,n),rdiag(n),acnorm(n),wa(n) >*/
/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,j,jp1,k,kmax,minmn >*/
/*<       double precision ajnorm,epsmch,one,p05,sum,temp,zero >*/
/*<       double precision dpmpar,enorm >*/
/*<       data one,p05,zero /1.0d0,5.0d-2,0.0d0/ >*/
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

/*<       epsmch = dpmpar(1) >*/
    epsmch = dpmpar_cvkit(&c__1);

/*     compute the initial column norms and initialize several arrays. */

/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          acnorm(j) = enorm(m,a(1,j)) >*/
	acnorm[j] = enorm_cvkit(m, &a[j * a_dim1 + 1]);
/*<          rdiag(j) = acnorm(j) >*/
	rdiag[j] = acnorm[j];
/*<          wa(j) = rdiag(j) >*/
	wa[j] = rdiag[j];
/*<          if (pivot) ipvt(j) = j >*/
	if (*pivot) {
	    ipvt[j] = j;
	}
/*<    10    continue >*/
/* L10: */
    }

/*     reduce a to r with householder transformations. */

/*<       minmn = min0(m,n) >*/
    minmn = min(*m,*n);
/*<       do 110 j = 1, minmn >*/
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
/*<          if (.not.pivot) go to 40 >*/
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

/*<          kmax = j >*/
	kmax = j;
/*<          do 20 k = j, n >*/
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
/*<             if (rdiag(k) .gt. rdiag(kmax)) kmax = k >*/
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/*<    20       continue >*/
/* L20: */
	}
/*<          if (kmax .eq. j) go to 40 >*/
	if (kmax == j) {
	    goto L40;
	}
/*<          do 30 i = 1, m >*/
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             temp = a(i,j) >*/
	    temp = a[i__ + j * a_dim1];
/*<             a(i,j) = a(i,kmax) >*/
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
/*<             a(i,kmax) = temp >*/
	    a[i__ + kmax * a_dim1] = temp;
/*<    30       continue >*/
/* L30: */
	}
/*<          rdiag(kmax) = rdiag(j) >*/
	rdiag[kmax] = rdiag[j];
/*<          wa(kmax) = wa(j) >*/
	wa[kmax] = wa[j];
/*<          k = ipvt(j) >*/
	k = ipvt[j];
/*<          ipvt(j) = ipvt(kmax) >*/
	ipvt[j] = ipvt[kmax];
/*<          ipvt(kmax) = k >*/
	ipvt[kmax] = k;
/*<    40    continue >*/
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

/*<          ajnorm = enorm(m-j+1,a(j,j)) >*/
	i__2 = *m - j + 1;
	ajnorm = enorm_cvkit(&i__2, &a[j + j * a_dim1]);
/*<          if (ajnorm .eq. zero) go to 100 >*/
	if (ajnorm == zero) {
	    goto L100;
	}
/*<          if (a(j,j) .lt. zero) ajnorm = -ajnorm >*/
	if (a[j + j * a_dim1] < zero) {
	    ajnorm = -ajnorm;
	}
/*<          do 50 i = j, m >*/
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
/*<             a(i,j) = a(i,j)/ajnorm >*/
	    a[i__ + j * a_dim1] /= ajnorm;
/*<    50       continue >*/
/* L50: */
	}
/*<          a(j,j) = a(j,j) + one >*/
	a[j + j * a_dim1] += one;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

/*<          jp1 = j + 1 >*/
	jp1 = j + 1;
/*<          if (n .lt. jp1) go to 100 >*/
	if (*n < jp1) {
	    goto L100;
	}
/*<          do 90 k = jp1, n >*/
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
/*<             sum = zero >*/
	    sum = zero;
/*<             do 60 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                sum = sum + a(i,j)*a(i,k) >*/
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/*<    60          continue >*/
/* L60: */
	    }
/*<             temp = sum/a(j,j) >*/
	    temp = sum / a[j + j * a_dim1];
/*<             do 70 i = j, m >*/
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
/*<                a(i,k) = a(i,k) - temp*a(i,j) >*/
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/*<    70          continue >*/
/* L70: */
	    }
/*<             if (.not.pivot .or. rdiag(k) .eq. zero) go to 80 >*/
	    if (! (*pivot) || rdiag[k] == zero) {
		goto L80;
	    }
/*<             temp = a(j,k)/rdiag(k) >*/
	    temp = a[j + k * a_dim1] / rdiag[k];
/*<             rdiag(k) = rdiag(k)*dsqrt(dmax1(zero,one-temp**2)) >*/
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = zero, d__2 = one - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/*<             if (p05*(rdiag(k)/wa(k))**2 .gt. epsmch) go to 80 >*/
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
/*<             rdiag(k) = enorm(m-j,a(jp1,k)) >*/
	    i__3 = *m - j;
	    rdiag[k] = enorm_cvkit(&i__3, &a[jp1 + k * a_dim1]);
/*<             wa(k) = rdiag(k) >*/
	    wa[k] = rdiag[k];
/*<    80       continue >*/
L80:
/*<    90       continue >*/
/* L90: */
	    ;
	}
/*<   100    continue >*/
L100:
/*<          rdiag(j) = -ajnorm >*/
	rdiag[j] = -ajnorm;
/*<   110    continue >*/
/* L110: */
    }
/*<       return >*/
    return 0;

/*     last card of subroutine qrfac. */

/*<       end >*/
}